

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

ImGuiTableSettings * __thiscall
ImChunkStream<ImGuiTableSettings>::alloc_chunk(ImChunkStream<ImGuiTableSettings> *this,size_t sz)

{
  int iVar1;
  uint *puVar2;
  uint uVar3;
  
  iVar1 = (this->Buf).Size;
  uVar3 = (int)sz + 7U & 0xfffffffc;
  ImVector<char>::resize(&this->Buf,iVar1 + uVar3);
  puVar2 = (uint *)((this->Buf).Data + iVar1);
  *puVar2 = uVar3;
  return (ImGuiTableSettings *)(puVar2 + 1);
}

Assistant:

T*      alloc_chunk(size_t sz)      { size_t HDR_SZ = 4; sz = IM_MEMALIGN(HDR_SZ + sz, 4u); int off = Buf.Size; Buf.resize(off + (int)sz); ((int*)(void*)(Buf.Data + off))[0] = (int)sz; return (T*)(void*)(Buf.Data + off + (int)HDR_SZ); }